

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::strip_whitespace(string *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  string ret;
  string local_48 [32];
  
  paVar1 = &ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  ret._M_dataplus._M_p = (pointer)paVar1;
  lVar2 = std::__cxx11::string::find_first_not_of((char *)str,0x2a80ec);
  if (lVar2 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_48);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)str);
    std::__cxx11::string::operator=((string *)&ret,local_48);
    std::__cxx11::string::_M_dispose();
    lVar2 = std::__cxx11::string::find_last_not_of((char *)&ret,0x2a80ec);
    if (lVar2 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = ret._M_string_length;
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      ret._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&ret);
    }
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

string strip_whitespace(const string &str)
{
	string ret;
	auto index = str.find_first_not_of(" \t");
	if (index == string::npos)
		return "";
	ret = str.substr(index, string::npos);
	index = ret.find_last_not_of(" \t");
	if (index != string::npos)
		return ret.substr(0, index + 1);
	else
		return ret;
}